

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_firstbyte,bool want_earliest_match,
          bool run_forward)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar4;
  iterator __position;
  bool bVar5;
  byte *pbVar6;
  void *pvVar7;
  State *pSVar8;
  State *pSVar9;
  byte *pbVar10;
  State *pSVar11;
  int *__dest;
  undefined7 in_register_00000009;
  byte *pbVar12;
  undefined7 in_register_00000011;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  Inst *pIVar16;
  size_t sVar17;
  ulong uVar18;
  undefined3 in_register_00000081;
  uint c;
  State *state;
  long lVar19;
  vector<int,_std::allocator<int>_> *v;
  StateSaver save_start;
  StateSaver save_s;
  byte *local_258;
  byte *local_248;
  byte *local_240;
  int *local_230;
  StateSaver local_228;
  uint local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  byte *local_1f0;
  ulong local_1e8;
  Prog *local_1e0;
  StateSaver local_1d8;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_1b0 [2];
  anon_union_4_5_a3ff96c3_for_Inst_2 local_1a8 [94];
  
  local_1f4 = (undefined4)CONCAT71(in_register_00000011,have_firstbyte);
  local_248 = (byte *)(params->text).ptr_;
  iVar2 = (params->text).length_;
  local_1f0 = local_248 + iVar2;
  pbVar12 = local_248;
  pbVar10 = local_1f0;
  if (CONCAT31(in_register_00000081,run_forward) != 0) {
    pbVar12 = local_1f0;
    pbVar10 = local_248;
  }
  pSVar11 = params->start;
  uVar14 = pSVar11->flag_ >> 0xc & 1;
  uVar15 = (ulong)uVar14;
  local_240 = (byte *)0x0;
  if (uVar14 != 0) {
    local_240 = pbVar10;
  }
  local_1f8 = (undefined4)CONCAT71(in_register_00000009,want_earliest_match);
  if (((byte)uVar14 & want_earliest_match) == 0) {
    pSVar8 = pSVar11;
    if (iVar2 != 0) {
      local_1e0 = this->prog_;
      local_1e8 = -(ulong)run_forward | 1;
      local_258 = (byte *)0x0;
      pbVar6 = pbVar10;
      state = pSVar11;
      do {
        if (((char)local_1f4 == '\0') || (state != pSVar11)) {
          if (!run_forward) goto LAB_00127ce4;
LAB_00127cbb:
          pbVar10 = pbVar6 + 1;
        }
        else {
          if (run_forward) {
            pbVar6 = (byte *)memchr(pbVar6,params->firstbyte,(long)pbVar12 - (long)pbVar6);
            pbVar10 = local_1f0;
            if (pbVar6 != (byte *)0x0) goto LAB_00127cbb;
            goto LAB_00127fc3;
          }
          pvVar7 = memrchr(local_248,params->firstbyte,(long)pbVar6 - (long)pbVar12);
          if (pvVar7 == (void *)0x0) goto LAB_00127fe5;
          pbVar6 = (byte *)((long)pvVar7 + 1);
LAB_00127ce4:
          pbVar6 = pbVar6 + -1;
          pbVar10 = pbVar6;
        }
        bVar13 = *pbVar6;
        pSVar8 = (State *)(&state[1].inst_)[local_1e0->bytemap_[bVar13]];
        if (pSVar8 == (State *)0x0) {
          pSVar8 = RunStateOnByteUnlocked(this,state,(uint)bVar13);
          if (pSVar8 == (State *)0x0) {
            if (((FLAGS_re2_dfa_bail_when_slow == '\x01') && (local_258 != (byte *)0x0)) &&
               ((ulong)((long)pbVar10 - (long)local_258) <
                (this->state_cache_)._M_h._M_element_count * 10)) {
              params->failed = true;
              goto LAB_001282a3;
            }
            local_1fc = (uint)uVar15;
            if (pSVar11 < (State *)0x3) {
              local_228.inst_ = (int *)0x0;
              local_228.ninst_ = 0;
              local_228.flag_ = 0;
              local_228.is_special_ = true;
              local_258 = (byte *)0x0;
              local_228.dfa_ = this;
              local_228.special_ = pSVar11;
            }
            else {
              local_228.is_special_ = false;
              local_228.special_ = (State *)0x0;
              local_228.ninst_ = pSVar11->ninst_;
              local_228.flag_ = pSVar11->flag_;
              sVar1 = (long)pSVar11->ninst_ * 4;
              sVar17 = sVar1;
              if ((long)pSVar11->ninst_ < 0) {
                sVar17 = 0xffffffffffffffff;
              }
              local_228.dfa_ = this;
              local_258 = (byte *)operator_new__(sVar17);
              local_228.inst_ = (int *)local_258;
              memmove(local_258,pSVar11->inst_,sVar1);
            }
            uVar15 = (ulong)local_1fc;
            local_1d8.dfa_ = this;
            if (state < (State *)0x3) {
              local_1d8.inst_ = (int *)0x0;
              local_1d8.ninst_ = 0;
              local_1d8.flag_ = 0;
              local_1d8.is_special_ = true;
              local_230 = (int *)0x0;
              local_1d8.special_ = state;
            }
            else {
              local_1d8.is_special_ = false;
              local_1d8.special_ = (State *)0x0;
              local_1d8.ninst_ = state->ninst_;
              local_1d8.flag_ = state->flag_;
              sVar1 = (long)state->ninst_ * 4;
              sVar17 = sVar1;
              if ((long)state->ninst_ < 0) {
                sVar17 = 0xffffffffffffffff;
              }
              local_230 = (int *)operator_new__(sVar17);
              local_1d8.inst_ = local_230;
              memmove(local_230,state->inst_,sVar1);
            }
            ResetCache(this,params->cache_lock);
            pSVar9 = StateSaver::Restore(&local_228);
            if ((pSVar9 == (State *)0x0) ||
               (pSVar8 = StateSaver::Restore(&local_1d8), pSVar8 == (State *)0x0)) {
LAB_00127f54:
              params->failed = true;
              bVar5 = false;
              pSVar8 = (State *)0x0;
            }
            else {
              pSVar8 = RunStateOnByteUnlocked(this,pSVar8,(uint)bVar13);
              if (pSVar8 == (State *)0x0) {
                LogMessage::LogMessage
                          ((LogMessage *)&local_1b0[0].field_3,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                           ,0x58e,3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8[0].field_3,
                           "RunStateOnByteUnlocked failed after ResetCache",0x2e);
                LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0[0].field_3);
                goto LAB_00127f54;
              }
              bVar5 = true;
            }
            if (((State *)0x2 < state) && (local_230 != (int *)0x0)) {
              operator_delete__(local_230);
            }
            if (((State *)0x2 < pSVar11) && (local_258 != (byte *)0x0)) {
              operator_delete__(local_258);
            }
            pSVar11 = pSVar9;
            local_258 = pbVar10;
            if (!bVar5) goto LAB_001282a3;
          }
        }
        if (pSVar8 < (State *)0x3) {
          pbVar6 = pbVar12;
          if (pSVar8 == (State *)0x1) goto LAB_0012827f;
          goto LAB_00128266;
        }
        if ((pSVar8->flag_ & 0x1000) != 0) {
          local_240 = pbVar10 + local_1e8;
          uVar15 = CONCAT71((int7)(uVar15 >> 8),1);
          pbVar6 = local_240;
          if ((char)local_1f8 != '\0') goto LAB_00128266;
        }
        pbVar6 = pbVar10;
        state = pSVar8;
      } while (pbVar10 != pbVar12);
    }
    state = pSVar8;
    local_248 = pbVar10;
    if (run_forward) {
LAB_00127fc3:
      pbVar6 = (byte *)((params->text).ptr_ + (params->text).length_);
      local_248 = pbVar10;
      if (pbVar6 == (byte *)((params->context).ptr_ + (params->context).length_)) goto LAB_00128007;
LAB_00127ff5:
      c = (uint)*pbVar6;
      uVar14 = (uint)this->prog_->bytemap_[*pbVar6];
    }
    else {
LAB_00127fe5:
      pcVar3 = (params->text).ptr_;
      if (pcVar3 != (params->context).ptr_) {
        pbVar6 = (byte *)(pcVar3 + -1);
        goto LAB_00127ff5;
      }
LAB_00128007:
      uVar14 = this->prog_->bytemap_range_;
      c = 0x100;
    }
    pSVar11 = (State *)(&state[1].inst_)[(int)uVar14];
    if ((pSVar11 == (State *)0x0) &&
       (pSVar11 = RunStateOnByteUnlocked(this,state,c), pSVar11 == (State *)0x0)) {
      if (state < (State *)0x3) {
        local_228.inst_ = (int *)0x0;
        local_228.ninst_ = 0;
        local_228.flag_ = 0;
        local_228.is_special_ = true;
        __dest = (int *)0x0;
        local_228.dfa_ = this;
        local_228.special_ = state;
      }
      else {
        local_228.is_special_ = false;
        local_228.special_ = (State *)0x0;
        local_228.ninst_ = state->ninst_;
        local_228.flag_ = state->flag_;
        sVar1 = (long)state->ninst_ * 4;
        uVar18 = 0xffffffffffffffff;
        if (-1 < (long)state->ninst_) {
          uVar18 = sVar1;
        }
        local_228.dfa_ = this;
        __dest = (int *)operator_new__(uVar18);
        local_228.inst_ = __dest;
        memmove(__dest,state->inst_,sVar1);
      }
      ResetCache(this,params->cache_lock);
      pSVar11 = StateSaver::Restore(&local_228);
      if (pSVar11 == (State *)0x0) {
LAB_0012815d:
        params->failed = true;
        bVar5 = false;
        pSVar11 = (State *)0x0;
      }
      else {
        pSVar11 = RunStateOnByteUnlocked(this,pSVar11,c);
        if (pSVar11 == (State *)0x0) {
          LogMessage::LogMessage
                    ((LogMessage *)&local_1b0[0].field_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                     0x5ce,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8[0].field_3,"RunStateOnByteUnlocked failed after Reset",
                     0x29);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0[0].field_3);
          goto LAB_0012815d;
        }
        bVar5 = true;
      }
      if (((State *)0x2 < state) && (__dest != (int *)0x0)) {
        operator_delete__(__dest);
      }
      if (!bVar5) {
LAB_001282a3:
        bVar13 = 0;
        goto LAB_00128283;
      }
    }
    pbVar6 = pbVar12;
    if (pSVar11 != (State *)0x2) {
      if (((State *)0x2 < pSVar11) && ((pSVar11->flag_ & 0x1000) != 0)) {
        this_00 = params->matches;
        uVar15 = 1;
        local_240 = local_248;
        if ((this_00 != (vector<int,_std::allocator<int>_> *)0x0) && (this->kind_ == kManyMatch)) {
          piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish != piVar4) {
            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_finish = piVar4;
          }
          if (0 < pSVar11->ninst_) {
            lVar19 = 0;
            do {
              pIVar16 = this->prog_->inst_ + pSVar11->inst_[lVar19];
              do {
                uVar14 = pIVar16->out_opcode_;
                if ((uVar14 & 7) == 5) {
                  local_1b0[0] = pIVar16->field_1;
                  __position._M_current =
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (this_00,__position,&local_1b0[0].cap_);
                  }
                  else {
                    *__position._M_current = (int)local_1b0[0];
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                  uVar14 = pIVar16->out_opcode_;
                }
                pIVar16 = pIVar16 + 1;
              } while ((uVar14 & 8) == 0);
              lVar19 = lVar19 + 1;
            } while (lVar19 < pSVar11->ninst_);
            uVar15 = 1;
          }
        }
      }
LAB_0012827f:
      bVar13 = (byte)uVar15;
      params->ep = (char *)local_240;
      goto LAB_00128283;
    }
LAB_00128266:
    params->ep = (char *)pbVar6;
  }
  else {
    params->ep = (char *)pbVar10;
  }
  bVar13 = 1;
LAB_00128283:
  return (bool)(bVar13 & 1);
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_firstbyte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8* bp = BytePtr(params->text.begin());  // start of text
  const uint8* p = bp;                              // text scanning point
  const uint8* ep = BytePtr(params->text.end());    // end of text
  const uint8* resetp = NULL;                       // p at last cache reset
  if (!run_forward)
    swap(p, ep);

  const uint8* bytemap = prog_->bytemap();
  const uint8* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;
  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (DebugDFA)
      fprintf(stderr, "@%d: %s\n", static_cast<int>(p - bp),
              DumpState(s).c_str());
    if (have_firstbyte && s == start) {
      // In start state, only way out is to find firstbyte,
      // so use optimized assembly in memchr to skip ahead.
      // If firstbyte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->firstbyte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->firstbyte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.
        if (FLAGS_re2_dfa_bail_when_slow && resetp != NULL &&
            static_cast<unsigned long>(p - resetp) < 10*state_cache_.size()) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }
    s = ns;

    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (DebugDFA)
        fprintf(stderr, "match @%d! [%s]\n",
                static_cast<int>(lastmatch - bp),
                DumpState(s).c_str());

      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  s = ns;
  if (DebugDFA)
    fprintf(stderr, "@_: %s\n", DumpState(s).c_str());
  if (s == FullMatchState) {
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }
  if (s > SpecialStateMax && s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches && kind_ == Prog::kManyMatch) {
      vector<int>* v = params->matches;
      v->clear();
      for (int i = 0; i < s->ninst_; i++) {
        Prog::Inst* ip = prog_->inst(s->inst_[i]);
        for (;;) {
          if (ip->opcode() == kInstMatch)
            v->push_back(ip->match_id());
          if (ip->last())
            break;
          ip++;
        }
      }
    }
    if (DebugDFA)
      fprintf(stderr, "match @%d! [%s]\n", static_cast<int>(lastmatch - bp),
              DumpState(s).c_str());
  }
  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}